

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

void __thiscall
YAML::detail::node_data::insert(node_data *this,node *key,node *value,shared_memory_holder *pMemory)

{
  undefined8 uVar1;
  node *in_RCX;
  node *in_RDX;
  node_data *in_RSI;
  long in_RDI;
  node *unaff_retaddr;
  Mark *in_stack_00000008;
  BadSubscript *in_stack_00000010;
  node_data *in_stack_ffffffffffffffd0;
  
  switch((shared_memory_holder *)(ulong)*(uint *)(in_RDI + 0x10)) {
  case (shared_memory_holder *)0x0:
  case (shared_memory_holder *)0x1:
  case (shared_memory_holder *)0x3:
    convert_to_map(in_stack_ffffffffffffffd0,(shared_memory_holder *)(ulong)*(uint *)(in_RDI + 0x10)
                  );
    break;
  case (shared_memory_holder *)0x2:
    uVar1 = __cxa_allocate_exception(0x40);
    BadSubscript::BadSubscript<YAML::detail::node>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    __cxa_throw(uVar1,&BadSubscript::typeinfo,BadSubscript::~BadSubscript);
  case (shared_memory_holder *)0x4:
  }
  insert_map_pair(in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void node_data::insert(node& key, node& value,
                       const shared_memory_holder& pMemory) {
  switch (m_type) {
    case NodeType::Map:
      break;
    case NodeType::Undefined:
    case NodeType::Null:
    case NodeType::Sequence:
      convert_to_map(pMemory);
      break;
    case NodeType::Scalar:
      throw BadSubscript(m_mark, key);
  }

  insert_map_pair(key, value);
}